

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManSetMark0Dfs_rec(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  
  while( true ) {
    pGVar2 = Gia_ManObj(p,iObj);
    uVar1 = (uint)*(ulong *)pGVar2;
    if ((((uVar1 >> 0x1e & 1) != 0) ||
        (*(ulong *)pGVar2 = *(ulong *)pGVar2 | 0x40000000, (int)uVar1 < 0)) ||
       ((uVar1 & 0x1fffffff) == 0x1fffffff)) break;
    Gia_ManSetMark0Dfs_rec(p,iObj - (uVar1 & 0x1fffffff));
    iObj = iObj - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Gia_ManSetMark0Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Gia_ManSetMark0Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Gia_ManSetMark0Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}